

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobox.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_3::RadioboxBase::~RadioboxBase(RadioboxBase *this)

{
  ~RadioboxBase(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

RadioboxBase(ConstStringListRef entries,
               int* selected,
               Ref<RadioboxOption> option)
      : entries_(entries), selected_(selected), option_(std::move(option)) {
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
    // Microsoft terminal do not use fonts able to render properly the default
    // radiobox glyph.
    if (option_->style_checked == "◉ ")
      option_->style_checked = "(*)";
    if (option_->style_unchecked == "○ ")
      option_->style_unchecked = "( )";
#endif
  }